

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_armor_upgrades.hpp
# Opt level: O2

uint32_t PatchArmorUpgrades::inject_function_change_item_in_reward_textbox
                   (ROM *rom,uint32_t function_alter_item_in_d0)

{
  uint32_t uVar1;
  Code func;
  string local_b8;
  Param local_98;
  undefined8 local_90;
  Code local_88;
  
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::jsr(&local_88,function_alter_item_in_d0);
  local_b8._M_string_length._0_1_ = 0;
  local_b8._M_dataplus._M_p = (pointer)&PTR_getXn_00246bf0;
  local_98._vptr_Param = (_func_int **)&PTR_getXn_00246ce8;
  local_90 = 0x200ff1196;
  md::Code::movew(&local_88,(Param *)&local_b8,&local_98);
  md::Code::rts(&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"",(allocator<char> *)&local_98);
  uVar1 = md::ROM::inject_code(rom,&local_88,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  md::Code::~Code(&local_88);
  return uVar1;
}

Assistant:

[[nodiscard]] static uint32_t inject_function_change_item_in_reward_textbox(md::ROM& rom, uint32_t function_alter_item_in_d0)
    {
        md::Code func;
        {
            func.jsr(function_alter_item_in_d0);
            func.movew(reg_D0, addr_(0xFF1196));
            func.rts();
        }
        return rom.inject_code(func);
    }